

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedDescribedEntity.h
# Opt level: O1

void __thiscall NamedDescribedEntity::~NamedDescribedEntity(NamedDescribedEntity *this)

{
  ~NamedDescribedEntity(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

std::string GetName() const {return _m_name;}